

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

long __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
::latency(cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
          *this)

{
  bool bVar1;
  uint32_t uVar2;
  cubeb_resampler_speex_one_way<short> *in_RDI;
  ulong local_8;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                      *)0x1176fb);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                          *)0x11770e), bVar1)) {
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x117721);
    uVar2 = cubeb_resampler_speex_one_way<short>::latency(in_RDI);
    local_8 = (ulong)uVar2;
  }
  else {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                        *)0x11773f);
    if (bVar1) {
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                    *)0x117752);
      uVar2 = cubeb_resampler_speex_one_way<short>::latency(in_RDI);
      local_8 = (ulong)uVar2;
    }
    else {
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                    *)0x117770);
      uVar2 = cubeb_resampler_speex_one_way<short>::latency(in_RDI);
      local_8 = (ulong)uVar2;
    }
  }
  return local_8;
}

Assistant:

virtual long latency()
  {
    if (input_processor && output_processor) {
      assert(input_processor->latency() == output_processor->latency());
      return input_processor->latency();
    } else if (input_processor) {
      return input_processor->latency();
    } else {
      return output_processor->latency();
    }
  }